

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O2

void __thiscall
directed_flag_complex_computer::store_coboundaries_in_cache_t::operator()
          (store_coboundaries_in_cache_t *this,vertex_index_t *first_vertex,int size)

{
  filtered_directed_graph_t *pfVar1;
  ulong uVar2;
  byte bVar3;
  ostream *poVar4;
  iterator iVar5;
  runtime_error *this_00;
  long lVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar7;
  short sVar8;
  ulong uVar9;
  ulong uVar10;
  int j;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  key_type local_c8;
  ulong local_b8;
  ushort local_b0 [4];
  ulong local_a8;
  ulong local_a0;
  ushort *local_98;
  long local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vertex_offsets;
  string local_70;
  string err;
  
  if ((this->is_first == true) && ((this->current_index + 1) % 10000 == 0)) {
    poVar4 = std::operator<<((ostream *)&std::cout,"\x1b[K");
    poVar4 = std::operator<<(poVar4,"dimension ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->current_dimension);
    poVar4 = std::operator<<(poVar4,": computed ca. ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    if (this->total_cell_number != 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"/");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    }
    std::operator<<((ostream *)&std::cout," coboundaries");
    poVar4 = (ostream *)std::ostream::flush();
    std::operator<<(poVar4,"\r");
  }
  compressed_sparse_matrix<int>::append_column(this->coboundary_matrix);
  vertex_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertex_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vertex_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar13 = 0;
  uVar9 = 0;
  if (0 < size) {
    uVar9 = (ulong)(uint)size;
  }
  for (; uVar9 != uVar13; uVar13 = uVar13 + 1) {
    local_c8._vptr_directed_flag_complex_cell_t = (_func_int **)(ulong)(first_vertex[uVar13] >> 6);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&vertex_offsets,(unsigned_long *)&local_c8);
  }
  local_90 = (long)size;
  lVar6 = -1;
  if (-1 < local_90) {
    lVar6 = local_90;
  }
  local_a8 = lVar6 + 1;
  uVar9 = 0;
  do {
    if (uVar9 == local_a8) {
      this->current_index = this->current_index + 1;
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&vertex_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return;
    }
    local_a0 = uVar9 & 0xffff;
    local_98 = (ushort *)((long)first_vertex - (ulong)((uint)((uVar9 & 0xffff) == 0) * 2));
    if (local_a0 == 0) {
      local_98 = local_b0;
    }
    uVar13 = 0;
    while( true ) {
      pfVar1 = this->graph;
      uVar2 = (pfVar1->super_directed_graph_t).incidence_row_length;
      if (uVar2 <= uVar13) break;
      uVar10 = 0xffffffffffffffff;
      for (uVar11 = 0; (uVar10 != 0 && ((long)uVar11 < local_90)); uVar11 = uVar11 + 1) {
        bVar3 = (byte)first_vertex[uVar11] & 0x3f;
        uVar12 = -2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3;
        if (vertex_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start[uVar11] != uVar13) {
          uVar12 = 0xffffffffffffffff;
        }
        pvVar7 = &(pfVar1->super_directed_graph_t).incidence_incoming;
        if (uVar11 < uVar9) {
          pvVar7 = &(pfVar1->super_directed_graph_t).incidence_outgoing;
        }
        uVar10 = uVar10 & uVar12 & (pvVar7->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_start
                                   [first_vertex[uVar11] * uVar2 + uVar13];
      }
      for (; uVar10 != 0; uVar10 = uVar10 & ~(1L << (uVar2 & 0x3f))) {
        uVar2 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        local_b0[0] = (ushort)uVar2 | (ushort)(uVar13 << 6);
        local_c8._vptr_directed_flag_complex_cell_t = (_func_int **)&PTR_vertex_0015c258;
        local_b8 = local_a0;
        sVar8 = (short)((ulong)*local_98 % this->nb_threads);
        local_c8.vertices = first_vertex;
        iVar5 = std::
                _Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)((this->cell_hash->
                           super__Vector_base<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + sVar8),&local_c8);
        if (iVar5.
            super__Node_iterator_base<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::__cxx11::string::string
                    ((string *)&err,"Could not find coboundary ",(allocator *)&local_70);
          directed_flag_complex_cell_t::to_string_abi_cxx11_
                    (&local_70,&local_c8,(short)this->current_dimension + 1);
          std::__cxx11::string::append((string *)&err);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::append((char *)&err);
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,(string *)&err);
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        compressed_sparse_matrix<int>::push_back
                  (this->coboundary_matrix,
                   (int)(this->cell_hash_offsets->
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                        super__Vector_impl_data._M_start[sVar8] +
                   *(int *)((long)iVar5.
                                  super__Node_iterator_base<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_true>
                                  ._M_cur + 0x18));
      }
      uVar13 = uVar13 + 1;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void operator()(vertex_index_t* first_vertex, int size) {
#ifdef INDICATE_PROGRESS
		if (is_first && (current_index + 1) % 10000 == 0) {
			std::cout << "\033[K"
			          << "dimension " << current_dimension << ": computed ca. " << nb_threads * (current_index + 1);
			if (total_cell_number > 0) std::cout << "/" << total_cell_number;
			std::cout << " coboundaries" << std::flush << "\r";
		}
#endif
		directed_flag_complex_cell_t cell(first_vertex);
		coboundary_matrix.append_column();

		std::vector<size_t> vertex_offsets;
		for (int j = 0; j < size; j++) vertex_offsets.push_back(first_vertex[j] >> 6);

		for (int i = 0; i <= size; i++) {
			// Check intersections in chunks of 64
			for (size_t offset = 0; offset < graph.incidence_row_length; offset++) {
				size_t bits = -1; // All bits set

				for (int j = 0; bits > 0 && j < size; j++) {
					// Remove the vertices already making up the cellk
					if (vertex_offsets[j] == offset) bits &= ~(ONE_ << (first_vertex[j] - (vertex_offsets[j] << 6)));

					// Intersect with the outgoing/incoming edges of the current
					// vertex
					bits &= j < i ? graph.get_outgoing_chunk(first_vertex[j], offset)
					              : graph.get_incoming_chunk(first_vertex[j], offset);
				}

				size_t vertex_offset = offset << 6;
				while (bits > 0) {
					// Get the least significant non-zero bit
					auto b = __builtin_ctzl(bits);

					// Unset this bit
					bits &= ~(ONE_ << b);

					// Now insert the appropriate vertex at this position
					const auto& cb = cell.insert_vertex(i, vertex_index_t(vertex_offset + b));
					const short thread_index = cb.vertex(0) % nb_threads;
					auto pair = cell_hash[thread_index].find(cb);
					if (pair == cell_hash[thread_index].end()) {
						std::string err = "Could not find coboundary ";
						err += cb.to_string(current_dimension + 1);
						err += ".\n";
						throw std::runtime_error(err);
					}
					coboundary_matrix.push_back(
					    make_entry(index_t(pair->second + cell_hash_offsets[thread_index]), i & 1 ? -1 + modulus : 1));
				}
			}
		}

		current_index++;
	}